

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool HasValidProofOfWork(vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers,
                        Params *consensusParams)

{
  bool bVar1;
  anon_class_8_1_6aab7ebd in_RSI;
  __normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
  in_RDI;
  long in_FS_OFFSET;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> *in_stack_ffffffffffffffd0;
  __normal_iterator<const_CBlockHeader_*,_std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>_>
  __first;
  
  __first._M_current = *(CBlockHeader **)(in_FS_OFFSET + 0x28);
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::cbegin(in_stack_ffffffffffffffd0);
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::cend(in_stack_ffffffffffffffd0);
  bVar1 = std::
          all_of<__gnu_cxx::__normal_iterator<CBlockHeader_const*,std::vector<CBlockHeader,std::allocator<CBlockHeader>>>,HasValidProofOfWork(std::vector<CBlockHeader,std::allocator<CBlockHeader>>const&,Consensus::Params_const&)::__0>
                    (__first,in_RDI,in_RSI);
  if (*(CBlockHeader **)(in_FS_OFFSET + 0x28) == __first._M_current) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool HasValidProofOfWork(const std::vector<CBlockHeader>& headers, const Consensus::Params& consensusParams)
{
    return std::all_of(headers.cbegin(), headers.cend(),
            [&](const auto& header) { return CheckProofOfWork(header.GetHash(), header.nBits, consensusParams);});
}